

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::printf(char *__format,...)

{
  int theY;
  char in_AL;
  int iVar1;
  cvui_block_t *theBlock;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_131;
  double local_130;
  String local_128;
  va_list aArgs;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_130 = in_XMM0_Qa;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  theBlock = internal::topBlock();
  aArgs[0].overflow_arg_area = &stack0x00000008;
  aArgs[0].gp_offset = 0x10;
  aArgs[0].fp_offset = 0x40;
  aArgs[0].reg_save_area = local_e8;
  vsprintf(internal::gBuffer,in_RSI,aArgs);
  iVar1 = (theBlock->anchor).x;
  theY = (theBlock->anchor).y;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,internal::gBuffer,&local_131);
  internal::text(theBlock,iVar1,theY,&local_128,local_130,(uint)__format,true);
  iVar1 = std::__cxx11::string::~string((string *)&local_128);
  return iVar1;
}

Assistant:

void printf(double theFontScale, unsigned int theColor, const char *theFmt, ...) {
	cvui_block_t& aBlock = internal::topBlock();
	va_list aArgs;

	va_start(aArgs, theFmt);
	vsprintf_s(internal::gBuffer, theFmt, aArgs);
	va_end(aArgs);

	internal::text(aBlock, aBlock.anchor.x, aBlock.anchor.y, internal::gBuffer, theFontScale, theColor, true);
}